

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O3

size_t __thiscall
capnp::_::PackedInputStream::tryRead
          (PackedInputStream *this,void *dst,size_t minBytes,size_t maxBytes)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  size_t extraout_RDX;
  byte *pbVar7;
  uint uVar8;
  long lVar9;
  uchar *__n;
  long lVar10;
  uchar *__n_00;
  void *__buf;
  byte *pbVar11;
  ArrayPtr<const_unsigned_char> AVar12;
  Fault f;
  byte *local_70;
  Fault local_40;
  size_t local_38;
  
  if (maxBytes == 0) {
    return 0;
  }
  iVar3 = (*(this->inner->super_InputStream)._vptr_InputStream[4])();
  pbVar7 = (byte *)CONCAT44(extraout_var,iVar3);
  AVar12.size_ = extraout_RDX;
  AVar12.ptr = pbVar7;
  if (extraout_RDX == 0) {
    return 0;
  }
  pbVar1 = (byte *)((long)dst + maxBytes);
  local_70 = (byte *)dst;
  local_38 = maxBytes;
LAB_00204131:
  while( true ) {
    pbVar11 = AVar12.ptr + AVar12.size_;
    if (9 < (ulong)((long)pbVar11 - (long)pbVar7)) break;
    if ((byte *)(minBytes + (long)dst) <= local_70) {
      (*(this->inner->super_InputStream)._vptr_InputStream[3])
                (this->inner,(long)pbVar7 - (long)AVar12.ptr);
      return (size_t)(local_70 + -(long)dst);
    }
    if (pbVar11 != pbVar7) {
      bVar2 = *pbVar7;
      pbVar7 = pbVar7 + 1;
      lVar9 = 0;
      lVar10 = 0;
      do {
        if ((bVar2 >> ((uint)lVar9 & 0x1f) & 1) == 0) {
          bVar4 = 0;
        }
        else {
          if (AVar12.ptr + AVar12.size_ == pbVar7) {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])();
            AVar12 = kj::BufferedInputStream::getReadBuffer(this->inner);
            pbVar7 = AVar12.ptr;
            if (AVar12.size_ == 0) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                        (&local_40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,0x59,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                         (char (*) [31])"Premature end of packed input.");
              pbVar11 = local_70 + (-lVar10 - (long)dst);
              goto LAB_00204504;
            }
          }
          bVar4 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        }
        local_70[lVar9] = bVar4;
        lVar10 = lVar10 + -1;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 8);
      pbVar11 = local_70 + -lVar10;
      if ((AVar12.ptr + AVar12.size_ == pbVar7) && ((byte)(bVar2 + 1) < 2)) {
        (*(this->inner->super_InputStream)._vptr_InputStream[3])();
        AVar12 = kj::BufferedInputStream::getReadBuffer(this->inner);
        pbVar7 = AVar12.ptr;
        if (AVar12.size_ == 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x62,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                     (char (*) [31])"Premature end of packed input.");
          kj::_::Debug::Fault::~Fault(&local_40);
          return (size_t)(local_70 + (-lVar10 - (long)dst));
        }
      }
      goto LAB_0020432b;
    }
    (*(this->inner->super_InputStream)._vptr_InputStream[3])();
    AVar12 = kj::BufferedInputStream::getReadBuffer(this->inner);
    pbVar7 = AVar12.ptr;
    if (AVar12.size_ == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,0x4d,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                 (char (*) [31])"Premature end of packed input.");
      kj::_::Debug::Fault::~Fault(&local_40);
      return (size_t)(local_70 + -(long)dst);
    }
  }
  bVar2 = *pbVar7;
  bVar4 = pbVar7[1];
  if ((bVar2 & 1) == 0) {
    bVar4 = 0;
  }
  *local_70 = bVar4;
  lVar9 = (ulong)(bVar2 & 1) + 1;
  uVar5 = bVar2 >> 1 & 1;
  local_70[1] = -(char)uVar5 & pbVar7[(ulong)(bVar2 & 1) + 1];
  lVar10 = (ulong)uVar5 + lVar9;
  uVar8 = bVar2 >> 2 & 1;
  local_70[2] = -(char)uVar8 & pbVar7[(ulong)uVar5 + lVar9];
  lVar9 = (ulong)uVar8 + lVar10;
  uVar6 = bVar2 >> 3 & 1;
  local_70[3] = -(char)uVar6 & pbVar7[(ulong)uVar8 + lVar10];
  uVar5 = bVar2 >> 4 & 1;
  lVar10 = (ulong)uVar6 + lVar9;
  local_70[4] = -(char)uVar5 & pbVar7[(ulong)uVar6 + lVar9];
  lVar9 = (ulong)uVar5 + lVar10;
  uVar6 = bVar2 >> 5 & 1;
  local_70[5] = -(char)uVar6 & pbVar7[(ulong)uVar5 + lVar10];
  lVar10 = (ulong)uVar6 + lVar9;
  uVar5 = bVar2 >> 6 & 1;
  local_70[6] = -(char)uVar5 & pbVar7[(ulong)uVar6 + lVar9];
  local_70[7] = (char)bVar2 >> 7 & pbVar7[(ulong)uVar5 + lVar10];
  pbVar11 = local_70 + 8;
  pbVar7 = pbVar7 + (ulong)(bVar2 >> 7) + (ulong)uVar5 + lVar10;
LAB_0020432b:
  if (bVar2 == 0xff) {
    __n_00 = (uchar *)((ulong)*pbVar7 * 8);
    if ((long)pbVar1 - (long)pbVar11 < (long)__n_00) {
      iVar3 = 0x8b;
LAB_00204570:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,iVar3,FAILED,"runLength <= outEnd - out",
                 "\"Packed input did not end cleanly on a segment boundary.\"",
                 (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
      pbVar11 = pbVar11 + -(long)dst;
LAB_00204504:
      kj::_::Debug::Fault::~Fault(&local_40);
      return (size_t)pbVar11;
    }
    pbVar7 = pbVar7 + 1;
    __n = AVar12.ptr + (AVar12.size_ - (long)pbVar7);
    if (__n < __n_00) {
      memcpy(pbVar11,pbVar7,(size_t)__n);
      __buf = (void *)(ulong)(uint)((int)__n_00 - (int)__n);
      (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar12.size_);
      kj::InputStream::read
                (&this->inner->super_InputStream,(int)(pbVar11 + (long)__n),__buf,(size_t)__buf);
      local_70 = pbVar11 + (long)__n + (long)__buf;
      if (local_70 == pbVar1) {
        return local_38;
      }
      AVar12 = kj::BufferedInputStream::getReadBuffer(this->inner);
      pbVar7 = AVar12.ptr;
      goto LAB_00204131;
    }
    memcpy(pbVar11,pbVar7,(size_t)__n_00);
    pbVar7 = pbVar7 + (long)__n_00;
LAB_00204419:
    pbVar11 = pbVar11 + (long)__n_00;
  }
  else if (bVar2 == 0) {
    __n_00 = (uchar *)((ulong)*pbVar7 * 8);
    if ((long)pbVar1 - (long)pbVar11 < (long)__n_00) {
      iVar3 = 0x7f;
      goto LAB_00204570;
    }
    pbVar7 = pbVar7 + 1;
    memset(pbVar11,0,(size_t)__n_00);
    goto LAB_00204419;
  }
  local_70 = pbVar11;
  if (pbVar11 == pbVar1) {
    (*(this->inner->super_InputStream)._vptr_InputStream[3])
              (this->inner,(long)pbVar7 - (long)AVar12.ptr);
    return local_38;
  }
  goto LAB_00204131;
}

Assistant:

size_t PackedInputStream::tryRead(void* dst, size_t minBytes, size_t maxBytes) {
  if (maxBytes == 0) {
    return 0;
  }

  KJ_DREQUIRE(minBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");
  KJ_DREQUIRE(maxBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  uint8_t* __restrict__ out = reinterpret_cast<uint8_t*>(dst);
  uint8_t* const outEnd = reinterpret_cast<uint8_t*>(dst) + maxBytes;
  uint8_t* const outMin = reinterpret_cast<uint8_t*>(dst) + minBytes;

  kj::ArrayPtr<const byte> buffer = inner.tryGetReadBuffer();
  if (buffer.size() == 0) {
    return 0;
  }
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { \
    return out - reinterpret_cast<uint8_t*>(dst); \
  } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

#define BUFFER_END (reinterpret_cast<const uint8_t*>(buffer.end()))
#define BUFFER_REMAINING ((size_t)(BUFFER_END - in))

  for (;;) {
    uint8_t tag;

    KJ_DASSERT((out - reinterpret_cast<uint8_t*>(dst)) % sizeof(word) == 0,
           "Output pointer should always be aligned here.");

    if (BUFFER_REMAINING < 10) {
      if (out >= outMin) {
        // We read at least the minimum amount, so go ahead and return.
        inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
        return out - reinterpret_cast<uint8_t*>(dst);
      }

      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          *out++ = *in++;
        } else {
          *out++ = 0;
        }
      }

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      { \
         bool isNonzero = (tag & (1u << n)) != 0; \
         *out++ = *in & (-(int8_t)isNonzero); \
         in += isNonzero; \
      }

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - reinterpret_cast<uint8_t*>(dst);
      }
      memset(out, 0, runLength);
      out += runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - reinterpret_cast<uint8_t*>(dst);
      }

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining >= runLength) {
        // Fast path.
        memcpy(out, in, runLength);
        out += runLength;
        in += runLength;
      } else {
        // Copy over the first buffer, then do one big read for the rest.
        memcpy(out, in, inRemaining);
        out += inRemaining;
        runLength -= inRemaining;

        inner.skip(buffer.size());
        inner.read(out, runLength);
        out += runLength;

        if (out == outEnd) {
          return maxBytes;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (out == outEnd) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return maxBytes;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
  return 0;  // GCC knows KJ_FAIL_ASSERT doesn't return, but Eclipse CDT still warns...

#undef REFRESH_BUFFER
}